

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufPtr xmlBufCreateSize(size_t size)

{
  xmlBufferAllocationScheme *pxVar1;
  xmlChar *pxVar2;
  size_t local_28;
  xmlBufPtr ret;
  size_t size_local;
  
  if (size == 0xffffffffffffffff) {
    size_local = 0;
  }
  else {
    size_local = (size_t)(*xmlMalloc)(0x40);
    if ((xmlBufPtr)size_local == (xmlBufPtr)0x0) {
      xmlBufMemoryError((xmlBufPtr)0x0,"creating buffer");
      size_local = 0;
    }
    else {
      ((xmlBufPtr)size_local)->use = 0;
      ((xmlBufPtr)size_local)->error = 0;
      ((xmlBufPtr)size_local)->buffer = (xmlBufferPtr)0x0;
      pxVar1 = __xmlBufferAllocScheme();
      ((xmlBufPtr)size_local)->alloc = *pxVar1;
      if (size == 0) {
        local_28 = 0;
      }
      else {
        local_28 = size + 1;
      }
      ((xmlBufPtr)size_local)->size = local_28;
      if (((xmlBufPtr)size_local)->size < 0x7fffffff) {
        ((xmlBufPtr)size_local)->compat_size = (uint)((xmlBufPtr)size_local)->size;
      }
      else {
        ((xmlBufPtr)size_local)->compat_size = 0x7fffffff;
      }
      if (((xmlBufPtr)size_local)->use < 0x7fffffff) {
        ((xmlBufPtr)size_local)->compat_use = (uint)((xmlBufPtr)size_local)->use;
      }
      else {
        ((xmlBufPtr)size_local)->compat_use = 0x7fffffff;
      }
      if (((xmlBufPtr)size_local)->size == 0) {
        ((xmlBufPtr)size_local)->content = (xmlChar *)0x0;
      }
      else {
        pxVar2 = (xmlChar *)(*xmlMallocAtomic)(((xmlBufPtr)size_local)->size);
        ((xmlBufPtr)size_local)->content = pxVar2;
        if (((xmlBufPtr)size_local)->content == (xmlChar *)0x0) {
          xmlBufMemoryError((xmlBufPtr)size_local,"creating buffer");
          (*xmlFree)((void *)size_local);
          return (xmlBufPtr)0x0;
        }
        *((xmlBufPtr)size_local)->content = '\0';
      }
      ((xmlBufPtr)size_local)->contentIO = (xmlChar *)0x0;
    }
  }
  return (xmlBufPtr)size_local;
}

Assistant:

xmlBufPtr
xmlBufCreateSize(size_t size) {
    xmlBufPtr ret;

    if (size == SIZE_MAX)
        return(NULL);
    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->alloc = xmlBufferAllocScheme;
    ret->size = (size ? size + 1 : 0);         /* +1 for ending null */
    UPDATE_COMPAT(ret);
    if (ret->size){
        ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
        if (ret->content == NULL) {
	    xmlBufMemoryError(ret, "creating buffer");
            xmlFree(ret);
            return(NULL);
        }
        ret->content[0] = 0;
    } else
	ret->content = NULL;
    ret->contentIO = NULL;
    return(ret);
}